

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blackhole-server.c
# Opt level: O1

int run_helper_tcp4_blackhole_server(void)

{
  int iVar1;
  undefined8 uVar2;
  char *pcVar3;
  sockaddr_in addr;
  undefined1 auStack_18 [16];
  
  uVar2 = uv_default_loop();
  iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,auStack_18);
  if (iVar1 == 0) {
    iVar1 = uv_tcp_init(uVar2,&tcp_server);
    if (iVar1 == 0) {
      iVar1 = uv_tcp_bind(&tcp_server,auStack_18,0);
      if (iVar1 == 0) {
        iVar1 = uv_listen(&tcp_server,0x80,connection_cb);
        if (iVar1 == 0) {
          notify_parent_process();
          uv_run(uVar2,0);
          pcVar3 = "0 && \"Blackhole server dropped out of event loop.\"";
          uVar2 = 0x77;
        }
        else {
          pcVar3 = "r == 0";
          uVar2 = 0x73;
        }
      }
      else {
        pcVar3 = "r == 0";
        uVar2 = 0x70;
      }
    }
    else {
      pcVar3 = "r == 0";
      uVar2 = 0x6d;
    }
  }
  else {
    pcVar3 = "0 == uv_ip4_addr(\"127.0.0.1\", TEST_PORT, &addr)";
    uVar2 = 0x6a;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/blackhole-server.c"
          ,uVar2,pcVar3);
  abort();
}

Assistant:

HELPER_IMPL(tcp4_blackhole_server) {
  struct sockaddr_in addr;
  uv_loop_t* loop;
  int r;

  loop = uv_default_loop();
  ASSERT(0 == uv_ip4_addr("127.0.0.1", TEST_PORT, &addr));

  r = uv_tcp_init(loop, &tcp_server);
  ASSERT(r == 0);

  r = uv_tcp_bind(&tcp_server, (const struct sockaddr*) &addr, 0);
  ASSERT(r == 0);

  r = uv_listen((uv_stream_t*)&tcp_server, 128, connection_cb);
  ASSERT(r == 0);

  notify_parent_process();
  r = uv_run(loop, UV_RUN_DEFAULT);
  ASSERT(0 && "Blackhole server dropped out of event loop.");

  return 0;
}